

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-to-string.cc
# Opt level: O0

bool __thiscall
double_conversion::DoubleToStringConverter::ToShortestIeeeNumber
          (DoubleToStringConverter *this,double value,StringBuilder *result_builder,DtoaMode mode)

{
  bool bVar1;
  int iVar2;
  DtoaMode in_EDX;
  double in_RSI;
  DoubleToStringConverter *in_RDI;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  int *in_stack_00000020;
  int exponent;
  bool unique_zero;
  int kDecimalRepCapacity;
  int decimal_rep_length;
  bool sign;
  int decimal_point;
  char decimal_rep [18];
  double in_stack_ffffffffffffff68;
  char c;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  StringBuilder *in_stack_ffffffffffffff78;
  int digits_after_point;
  undefined4 in_stack_ffffffffffffff80;
  int decimal_point_00;
  undefined4 in_stack_ffffffffffffff84;
  int length;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 uVar3;
  undefined4 uVar4;
  bool local_45;
  int local_44 [3];
  byte local_35;
  int local_34 [3];
  undefined1 *local_28;
  undefined1 *local_20;
  undefined2 local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  Double::Double((Double *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                 in_stack_ffffffffffffff68);
  bVar1 = Double::IsSpecial((Double *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70))
  ;
  if (bVar1) {
    local_45 = HandleSpecialValues(in_RDI,(double)CONCAT44(in_stack_ffffffffffffff84,
                                                           in_stack_ffffffffffffff80),
                                   in_stack_ffffffffffffff78);
  }
  else {
    local_34[0] = -0x55555556;
    local_35 = 0xaa;
    uVar4 = 0x12;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = 0xaaaa;
    local_44[2] = -0x55555556;
    c = (char)((ulong)local_34 >> 0x38);
    DoubleToAscii(in_RSI,in_EDX,0x12,
                  (char *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  (int)((ulong)in_RDI >> 0x20),
                  (bool *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                  (int *)in_stack_ffffffffffffff78,in_stack_00000020);
    bVar1 = (in_RDI->flags_ & 8U) != 0;
    uVar3 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff94);
    if (((local_35 & 1) != 0) && (((in_XMM0_Qa != 0.0 || (NAN(in_XMM0_Qa))) || (!bVar1)))) {
      StringBuilder::AddCharacter
                ((StringBuilder *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),c);
    }
    iVar2 = local_34[0] + -1;
    if ((iVar2 < in_RDI->decimal_in_shortest_low_) || (in_RDI->decimal_in_shortest_high_ <= iVar2))
    {
      CreateExponentialRepresentation
                ((DoubleToStringConverter *)CONCAT44(in_EDX,uVar4),(char *)CONCAT44(uVar3,iVar2),
                 (int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                 (StringBuilder *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    }
    else {
      digits_after_point = (int)((ulong)&local_28 >> 0x20);
      local_44[1] = 0;
      local_44[0] = local_44[2] - local_34[0];
      decimal_point_00 = local_44[2];
      length = local_34[0];
      std::max<int>(local_44 + 1,local_44);
      CreateDecimalRepresentation
                ((DoubleToStringConverter *)CONCAT44(uVar3,iVar2),(char *)in_RDI,length,
                 decimal_point_00,digits_after_point,
                 (StringBuilder *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
    }
    local_45 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_45;
  }
  __stack_chk_fail();
}

Assistant:

bool DoubleToStringConverter::ToShortestIeeeNumber(
    double value,
    StringBuilder* result_builder,
    DoubleToStringConverter::DtoaMode mode) const {
  DOUBLE_CONVERSION_ASSERT(mode == SHORTEST || mode == SHORTEST_SINGLE);
  if (Double(value).IsSpecial()) {
    return HandleSpecialValues(value, result_builder);
  }

  int decimal_point;
  bool sign;
  const int kDecimalRepCapacity = kBase10MaximalLength + 1;
  char decimal_rep[kDecimalRepCapacity];
  int decimal_rep_length;

  DoubleToAscii(value, mode, 0, decimal_rep, kDecimalRepCapacity,
                &sign, &decimal_rep_length, &decimal_point);

  bool unique_zero = (flags_ & UNIQUE_ZERO) != 0;
  if (sign && (value != 0.0 || !unique_zero)) {
    result_builder->AddCharacter('-');
  }

  int exponent = decimal_point - 1;
  if ((decimal_in_shortest_low_ <= exponent) &&
      (exponent < decimal_in_shortest_high_)) {
    CreateDecimalRepresentation(decimal_rep, decimal_rep_length,
                                decimal_point,
                                (std::max)(0, decimal_rep_length - decimal_point),
                                result_builder);
  } else {
    CreateExponentialRepresentation(decimal_rep, decimal_rep_length, exponent,
                                    result_builder);
  }
  return true;
}